

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O2

void __thiscall r_exec::AntiPGMController::signal_anti_pgm(AntiPGMController *this)

{
  mutex *__mutex;
  list<core::P<r_exec::Overlay>_> *this_00;
  InputLessPGMOverlay *this_01;
  atomic_int_fast64_t *paVar1;
  InputLessPGMOverlay *in_RAX;
  P<r_exec::Overlay> local_28;
  
  __mutex = &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex;
  local_28.object = (_Object *)in_RAX;
  std::mutex::lock(__mutex);
  if ((this->super__PGMController).field_0x99 == '\x01') {
    (this->super__PGMController).field_0x99 = 0;
  }
  else {
    this_01 = (InputLessPGMOverlay *)
              (this->super__PGMController).super_OController.overlays.cells.
              super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
              ._M_impl.super__Vector_impl_data._M_start
              [(this->super__PGMController).super_OController.overlays.used_cells_head].data.object;
    InputLessPGMOverlay::inject_productions(this_01);
    (*(this_01->super_Overlay).super__Object._vptr__Object[2])(this_01);
    if ((((this->super__PGMController).run_once == false) &&
        ((this->super__PGMController).super_OController.super_Controller.invalidated == 0)) &&
       ((this->super__PGMController).super_OController.super_Controller.activated == 1)) {
      this_00 = &(this->super__PGMController).super_OController.overlays;
      r_code::list<core::P<r_exec::Overlay>_>::clear(this_00);
      LOCK();
      paVar1 = &(this_01->super_Overlay).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      local_28.object = (_Object *)this_01;
      r_code::list<core::P<r_exec::Overlay>_>::push_back(this_00,&local_28);
      core::P<r_exec::Overlay>::~P(&local_28);
    }
  }
  if ((this->super__PGMController).run_once == true) {
    (*(this->super__PGMController).super_OController.super_Controller.super__Object._vptr__Object[3]
    )(this);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void AntiPGMController::signal_anti_pgm()
{
    std::lock_guard<std::mutex> guard(m_reductionMutex);

    if (successful_match) { // a signaling job has been spawn in restart(): we are here in an old job during which a positive match occurred: do nothing.
        successful_match = false;
    } else { // no positive match during this job: inject productions and restart.
        Overlay *overlay = overlays.front();
        ((AntiPGMOverlay *)overlay)->inject_productions();
        overlay->reset(); // reset the first overlay and kill all others.

        if (!run_once && is_alive()) {
            overlays.clear();
            overlays.push_back(overlay);
        }
    }

    if (run_once) {
        invalidate();
    }
}